

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testCorrectEncode(double lat,double lon,int treatAsError)

{
  uint uVar1;
  char *pcVar2;
  undefined1 local_2a0 [4];
  int nrResults;
  Mapcodes mapcodes;
  int treatAsError_local;
  double lon_local;
  double lat_local;
  
  mapcodes.mapcode[0x15]._23_4_ = treatAsError;
  unique0x1000006e = lon;
  uVar1 = encodeLatLonToMapcodes((Mapcodes *)local_2a0,lat,lon,TERRITORY_UNKNOWN,0);
  if ((int)uVar1 < 1) {
    if (mapcodes.mapcode[0x15]._23_4_ != 0) {
      foundError();
    }
    pcVar2 = "WARNING";
    if (mapcodes.mapcode[0x15]._23_4_ != 0) {
      pcVar2 = "ERROR";
    }
    printf("*** %s *** encodeLatLonToMapcodes returns \'%d\' (should be > 0) for lat=%f, lon=%f\n",
           lat,stack0xffffffffffffffe8,pcVar2,(ulong)uVar1);
  }
  return 1;
}

Assistant:

static int testCorrectEncode(double lat, double lon, int treatAsError) {
    Mapcodes mapcodes;
    int nrResults = encodeLatLonToMapcodes(&mapcodes, lat, lon, TERRITORY_UNKNOWN, 0);
    if (nrResults <= 0) {
        if (treatAsError) {
            foundError();
        }
        printf("*** %s *** encodeLatLonToMapcodes returns '%d' (should be > 0) for lat=%f, lon=%f\n",
               treatAsError ? "ERROR" : "WARNING", nrResults, lat, lon);
    }
    return 1;
}